

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

bool __thiscall i2p::sam::Session::Accept(Session *this,Connection *conn)

{
  long lVar1;
  _Head_base<0UL,_Sock_*,_false> _Var2;
  bool bVar3;
  char cVar4;
  Logger *pLVar5;
  int iVar6;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  Event occurred;
  Binary local_d8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  undefined1 local_b0 [24];
  CNetAddr peer_addr;
  string peer_dest;
  string errmsg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  do {
    bVar3 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar3) goto LAB_0088a8c8;
    _Var2._M_head_impl =
         (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    cVar4 = (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 0x70))
                      (_Var2._M_head_impl,1000,1,&occurred);
    if (cVar4 == '\0') {
      iVar6 = 3;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&errmsg,0,errmsg._M_string_length,"wait on socket failed",0x15);
    }
    else {
      iVar6 = 2;
      if (occurred != '\0') {
        peer_dest._M_dataplus._M_p = (pointer)&peer_dest.field_2;
        peer_dest._M_string_length = 0;
        peer_dest.field_2._M_local_buf[0] = '\0';
        _Var2._M_head_impl =
             (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
             super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
             super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 0x90))
                  ((CService *)&criticalblock9,_Var2._M_head_impl,10,1000,this->m_interrupt,0x10000)
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&peer_dest,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock9);
        if (criticalblock9.super_unique_lock._M_device != (mutex_type *)local_b0) {
          operator_delete(criticalblock9.super_unique_lock._M_device,
                          CONCAT44(local_b0._4_4_,local_b0._0_4_) + 1);
        }
        CNetAddr::CNetAddr(&peer_addr);
        DecodeI2PBase64(&local_d8,&peer_dest);
        DestBinToAddr((CNetAddr *)&criticalblock9,&local_d8);
        if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (0x10 < peer_addr.m_addr._size) {
          free(peer_addr.m_addr._union.indirect_contents.indirect);
        }
        peer_addr.m_addr._union.indirect_contents.indirect =
             (char *)criticalblock9.super_unique_lock._M_device;
        peer_addr.m_addr._size = local_b0._0_4_;
        peer_addr.m_net = local_b0._8_4_;
        peer_addr.m_scope_id = local_b0._12_4_;
        CService::CService((CService *)&criticalblock9,&peer_addr,0);
        if (0x10 < (conn->peer).super_CNetAddr.m_addr._size) {
          free((conn->peer).super_CNetAddr.m_addr._union.indirect_contents.indirect);
        }
        (conn->peer).super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)criticalblock9.super_unique_lock._M_device;
        *(ulong *)((long)&(conn->peer).super_CNetAddr.m_addr._union + 8) =
             CONCAT71(criticalblock9.super_unique_lock._9_7_,
                      criticalblock9.super_unique_lock._M_owns);
        (conn->peer).super_CNetAddr.m_addr._size = local_b0._0_4_;
        local_b0._0_4_ = 0;
        (conn->peer).super_CNetAddr.m_net = local_b0._8_4_;
        (conn->peer).super_CNetAddr.m_scope_id = local_b0._12_4_;
        (conn->peer).port = local_b0._16_2_;
        iVar6 = 1;
        if (0x10 < peer_addr.m_addr._size) {
          free(peer_addr.m_addr._union.indirect_contents.indirect);
          peer_addr.m_addr._union.indirect_contents.indirect = (char *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)peer_dest._M_dataplus._M_p != &peer_dest.field_2) {
          operator_delete(peer_dest._M_dataplus._M_p,
                          CONCAT71(peer_dest.field_2._M_allocated_capacity._1_7_,
                                   peer_dest.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  } while (iVar6 == 2);
  if (iVar6 == 3) {
LAB_0088a8c8:
    bVar3 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar3) {
      pLVar5 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,I2P,Debug);
      if (bVar3) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "Accept";
        logging_function._M_len = 6;
        LogPrintFormatInternal<>
                  (logging_function,source_file,0xd0,I2P,Debug,(ConstevalFormatString<0U>)0xf91c5e);
      }
    }
    else {
      pLVar5 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,I2P,Debug);
      if (bVar3) {
        criticalblock9.super_unique_lock._M_device = (mutex_type *)0xf6cf21;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
        ;
        source_file_00._M_len = 0x57;
        logging_function_00._M_str = "Accept";
        logging_function_00._M_len = 6;
        LogPrintFormatInternal<char_const*,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xd2,I2P,Debug,
                   (ConstevalFormatString<2U>)0xf91c76,(char **)&criticalblock9,&errmsg);
      }
    }
    CheckControlSock(this);
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errmsg._M_dataplus._M_p != &errmsg.field_2) {
    operator_delete(errmsg._M_dataplus._M_p,
                    CONCAT71(errmsg.field_2._M_allocated_capacity._1_7_,
                             errmsg.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Session::Accept(Connection& conn)
{
    AssertLockNotHeld(m_mutex);

    std::string errmsg;
    bool disconnect{false};

    while (!*m_interrupt) {
        Sock::Event occurred;
        if (!conn.sock->Wait(MAX_WAIT_FOR_IO, Sock::RECV, &occurred)) {
            errmsg = "wait on socket failed";
            break;
        }

        if (occurred == 0) {
            // Timeout, no incoming connections or errors within MAX_WAIT_FOR_IO.
            continue;
        }

        std::string peer_dest;
        try {
            peer_dest = conn.sock->RecvUntilTerminator('\n', MAX_WAIT_FOR_IO, *m_interrupt, MAX_MSG_SIZE);
        } catch (const std::runtime_error& e) {
            errmsg = e.what();
            break;
        }

        CNetAddr peer_addr;
        try {
            peer_addr = DestB64ToAddr(peer_dest);
        } catch (const std::runtime_error& e) {
            // The I2P router is expected to send the Base64 of the connecting peer,
            // but it may happen that something like this is sent instead:
            // STREAM STATUS RESULT=I2P_ERROR MESSAGE="Session was closed"
            // In that case consider the session damaged and close it right away,
            // even if the control socket is alive.
            if (peer_dest.find("RESULT=I2P_ERROR") != std::string::npos) {
                errmsg = strprintf("unexpected reply that hints the session is unusable: %s", peer_dest);
                disconnect = true;
            } else {
                errmsg = e.what();
            }
            break;
        }

        conn.peer = CService(peer_addr, I2P_SAM31_PORT);

        return true;
    }

    if (*m_interrupt) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Accept was interrupted\n");
    } else {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error accepting%s: %s\n", disconnect ? " (will close the session)" : "", errmsg);
    }
    if (disconnect) {
        LOCK(m_mutex);
        Disconnect();
    } else {
        CheckControlSock();
    }
    return false;
}